

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O0

void build_staircase_rooms(chunk_conflict *c,char *label)

{
  room_profile profile_00;
  _Bool _Var1;
  int iVar2;
  char *title;
  int local_64;
  connector *pcStack_60;
  wchar_t i;
  connector *join;
  room_profile profile;
  wchar_t num_rooms;
  char *label_local;
  chunk_conflict *c_local;
  
  profile._52_4_ = dun->profile->n_room_profiles;
  for (local_64 = 0; local_64 < (int)profile._52_4_; local_64 = local_64 + 1) {
    memcpy(&join,dun->profile->room_profiles + local_64,0x38);
    iVar2 = strcmp((char *)profile.next,"staircase room");
    if (iVar2 == 0) break;
  }
  if ((int)profile._52_4_ <= local_64) {
    __assert_fail("i < num_rooms",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/gen-cave.c"
                  ,0x39d,"void build_staircase_rooms(struct chunk *, const char *)");
  }
  for (pcStack_60 = dun->join; pcStack_60 != (connector *)0x0; pcStack_60 = pcStack_60->next) {
    dun->curr_join = pcStack_60;
    profile_00.name = (char *)profile.next;
    profile_00.next = (room_profile *)join;
    profile_00.builder = (room_builder_conflict)profile.name;
    profile_00._24_8_ = profile.builder;
    profile_00.width = profile.rating;
    profile_00.level = profile.height;
    profile_00._40_8_ = profile._32_8_;
    profile_00._48_8_ = profile._40_8_;
    _Var1 = room_build(c,((pcStack_60->grid).y + L'\xffffffff') / dun->block_hgt,
                       ((pcStack_60->grid).x + L'\xffffffff') / dun->block_wid,profile_00,true);
    if (!_Var1) {
      title = format("%s:  Failed to Build Staircase Room at Row=%d Column=%d in a Cave with %d Rows and %d Columns"
                     ,label,(ulong)(uint)(pcStack_60->grid).y,(ulong)(uint)(pcStack_60->grid).x,
                     (ulong)(uint)c->height,(ulong)(uint)c->width);
      dump_level_simple((char *)0x0,title,c);
      quit("Failed to place stairs");
    }
    dun->nstair_room = dun->nstair_room + L'\x01';
  }
  return;
}

Assistant:

static void build_staircase_rooms(struct chunk *c, const char *label)
{
	int num_rooms = dun->profile->n_room_profiles;
	struct room_profile profile;
	struct connector *join;
	int i;

	for (i = 0; i < num_rooms; i++) {
		profile = dun->profile->room_profiles[i];
		if (streq(profile.name, "staircase room")) {
			break;
		}
	}
	assert(i < num_rooms);
	for (join = dun->join; join; join = join->next) {
		dun->curr_join = join;
		if (!room_build(c, (join->grid.y - 1) / dun->block_hgt,
				(join->grid.x - 1) / dun->block_wid,
				profile, true)) {
			dump_level_simple(NULL, format("%s:  Failed to Build "
				"Staircase Room at Row=%d Column=%d in a "
				"Cave with %d Rows and %d Columns", label,
				join->grid.y, join->grid.x, c->height,
				c->width), c);
			quit("Failed to place stairs");
		}
		++dun->nstair_room;
	}
}